

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlNodeSetContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  xmlDictPtr dict;
  _xmlNode *p_Var2;
  _xmlNode *p_Var3;
  int iVar4;
  xmlChar *pxVar5;
  _xmlNode *p_Var6;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (XML_NOTATION_NODE < xVar1) {
    return;
  }
  if ((0x11f8U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    if ((0x806U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      return;
    }
    if (cur->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(cur->children);
    }
    p_Var6 = xmlStringLenGetNodeList(cur->doc,content,len);
    cur->children = p_Var6;
    if (p_Var6 != (xmlNodePtr)0x0) {
      p_Var3 = p_Var6->next;
      while (p_Var2 = p_Var3, p_Var2 != (_xmlNode *)0x0) {
        p_Var6->parent = cur;
        p_Var6 = p_Var2;
        p_Var3 = p_Var2->next;
      }
      p_Var6->parent = cur;
      cur->last = p_Var6;
      return;
    }
    cur->last = (_xmlNode *)0x0;
    return;
  }
  pxVar5 = cur->content;
  if ((_xmlAttr **)pxVar5 != &cur->properties && pxVar5 != (xmlChar *)0x0) {
    if ((cur->doc != (_xmlDoc *)0x0) && (dict = cur->doc->dict, dict != (xmlDictPtr)0x0)) {
      iVar4 = xmlDictOwns(dict,pxVar5);
      if (iVar4 != 0) goto LAB_0018607f;
      pxVar5 = cur->content;
    }
    (*xmlFree)(pxVar5);
  }
LAB_0018607f:
  if (cur->children != (xmlNodePtr)0x0) {
    xmlFreeNodeList(cur->children);
  }
  cur->children = (_xmlNode *)0x0;
  cur->last = (_xmlNode *)0x0;
  if (content == (xmlChar *)0x0) {
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar5 = xmlStrndup(content,len);
  }
  cur->content = pxVar5;
  cur->properties = (_xmlAttr *)0x0;
  return;
}

Assistant:

void
xmlNodeSetContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeSetContentLen : node == NULL\n");
#endif
	return;
    }
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if (cur->children != NULL) xmlFreeNodeList(cur->children);
	    cur->children = xmlStringLenGetNodeList(cur->doc, content, len);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NOTATION_NODE:
	    if ((cur->content != NULL) &&
	        (cur->content != (xmlChar *) &(cur->properties))) {
	        if (!((cur->doc != NULL) && (cur->doc->dict != NULL) &&
		    (xmlDictOwns(cur->doc->dict, cur->content))))
		    xmlFree(cur->content);
	    }
	    if (cur->children != NULL) xmlFreeNodeList(cur->children);
	    cur->children = cur->last = NULL;
	    if (content != NULL) {
		cur->content = xmlStrndup(content, len);
	    } else
		cur->content = NULL;
	    cur->properties = NULL;
	    break;
        case XML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    break;
        case XML_ELEMENT_DECL:
	    /* TODO !!! */
	    break;
        case XML_ATTRIBUTE_DECL:
	    /* TODO !!! */
	    break;
        case XML_ENTITY_DECL:
	    /* TODO !!! */
	    break;
    }
}